

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall embree::Application::~Application(Application *this)

{
  this->_vptr_Application = (_func_int **)&PTR__Application_002adc30;
  instance = 0;
  CommandLineParser::~CommandLineParser(&this->commandLineParser);
  std::__cxx11::string::~string((string *)&this->rtcore);
  return;
}

Assistant:

Application::~Application()
  {
    assert(instance == this);
    instance = nullptr;
  }